

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecretKey.cpp
# Opt level: O0

int __thiscall jbcoin::sign(jbcoin *this,PublicKey *pk,SecretKey *sk,Slice *m)

{
  basic_sha512_half_hasher *this_00;
  bool bVar1;
  int iVar2;
  reference_const_type pKVar3;
  uint8_t *puVar4;
  size_t sVar5;
  uint8_t *sk_00;
  uint8_t *puVar6;
  uint8_t *RS;
  secp256k1_context *psVar7;
  const_pointer msg32;
  allocator local_279;
  string local_278;
  allocator local_251;
  string local_250;
  size_t local_230;
  size_t len;
  uchar sig [72];
  allocator local_1d1;
  string local_1d0;
  undefined1 local_1b0 [8];
  secp256k1_ecdsa_signature sig_imp;
  result_type digest;
  sha512_half_hasher h;
  allocator local_61;
  string local_60;
  Slice local_40;
  type local_30;
  optional<jbcoin::KeyType> type;
  Slice *m_local;
  SecretKey *sk_local;
  PublicKey *pk_local;
  Buffer *b;
  
  type.super_type = (type)m;
  local_40 = PublicKey::slice(pk);
  local_30 = (type)publicKeyType(&local_40);
  bVar1 = boost::optional<jbcoin::KeyType>::operator!((optional<jbcoin::KeyType> *)&local_30);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"sign: invalid type",&local_61);
    LogicError(&local_60);
  }
  pKVar3 = boost::optional<jbcoin::KeyType>::operator*((optional<jbcoin::KeyType> *)&local_30);
  if (*pKVar3 == secp256k1) {
    this_00 = (basic_sha512_half_hasher *)((long)digest.pn + 0x1b);
    detail::basic_sha512_half_hasher<false>::basic_sha512_half_hasher
              ((basic_sha512_half_hasher<false> *)this_00);
    puVar4 = Slice::data((Slice *)type.super_type);
    sVar5 = Slice::size((Slice *)type.super_type);
    detail::basic_sha512_half_hasher<false>::operator()
              ((basic_sha512_half_hasher<false> *)this_00,puVar4,sVar5);
    detail::basic_sha512_half_hasher::operator_cast_to_base_uint
              ((result_type *)(sig_imp.data + 0x38),this_00);
    psVar7 = secp256k1Context<void>();
    msg32 = base_uint<256UL,_void>::data((base_uint<256UL,_void> *)(sig_imp.data + 0x38));
    puVar4 = SecretKey::data(sk);
    iVar2 = secp256k1_ecdsa_sign
                      (psVar7,(secp256k1_ecdsa_signature *)local_1b0,msg32,puVar4,
                       nonce_function_rfc6979,(void *)0x0);
    if (iVar2 != 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1d0,"sign: secp256k1_ecdsa_sign failed",&local_1d1);
      LogicError(&local_1d0);
    }
    local_230 = 0x48;
    psVar7 = secp256k1Context<void>();
    iVar2 = secp256k1_ecdsa_signature_serialize_der
                      (psVar7,(uchar *)&len,&local_230,(secp256k1_ecdsa_signature *)local_1b0);
    if (iVar2 != 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_250,"sign: secp256k1_ecdsa_signature_serialize_der failed",
                 &local_251);
      LogicError(&local_250);
    }
    Buffer::Buffer((Buffer *)this,&len,local_230);
    detail::basic_sha512_half_hasher<false>::~basic_sha512_half_hasher
              ((basic_sha512_half_hasher<false> *)((long)digest.pn + 0x1b));
  }
  else {
    if (*pKVar3 != ed25519) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_278,"sign: invalid type",&local_279);
      LogicError(&local_278);
    }
    Buffer::Buffer((Buffer *)this,0x40);
    puVar4 = Slice::data((Slice *)type.super_type);
    sVar5 = Slice::size((Slice *)type.super_type);
    sk_00 = SecretKey::data(sk);
    puVar6 = PublicKey::data(pk);
    RS = Buffer::data((Buffer *)this);
    ed25519_sign(puVar4,sVar5,sk_00,puVar6 + 1,RS);
  }
  return (int)this;
}

Assistant:

Buffer
sign (PublicKey const& pk,
    SecretKey const& sk, Slice const& m)
{
    auto const type =
        publicKeyType(pk.slice());
    if (! type)
        LogicError("sign: invalid type");
    switch(*type)
    {
    case KeyType::ed25519:
    {
        Buffer b(64);
        ed25519_sign(m.data(), m.size(),
            sk.data(), pk.data() + 1, b.data());
        return b;
    }
    case KeyType::secp256k1:
    {
        sha512_half_hasher h;
        h(m.data(), m.size());
        auto const digest =
            sha512_half_hasher::result_type(h);

        secp256k1_ecdsa_signature sig_imp;
        if(secp256k1_ecdsa_sign(
                secp256k1Context(),
                &sig_imp,
                reinterpret_cast<unsigned char const*>(
                    digest.data()),
                reinterpret_cast<unsigned char const*>(
                    sk.data()),
                secp256k1_nonce_function_rfc6979,
                nullptr) != 1)
            LogicError("sign: secp256k1_ecdsa_sign failed");

        unsigned char sig[72];
        size_t len = sizeof(sig);
        if(secp256k1_ecdsa_signature_serialize_der(
                secp256k1Context(),
                sig,
                &len,
                &sig_imp) != 1)
            LogicError("sign: secp256k1_ecdsa_signature_serialize_der failed");

        return Buffer{sig, len};
    }
    default:
        LogicError("sign: invalid type");
    }
}